

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hh
# Opt level: O2

void __thiscall kratos::Context::Context(Context *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->modules_)._M_h._M_buckets = &(this->modules_)._M_h._M_single_bucket;
  (this->modules_)._M_h._M_bucket_count = 1;
  (this->modules_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modules_)._M_h._M_element_count = 0;
  (this->modules_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modules_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modules_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->generator_hash_)._M_h._M_buckets = &(this->generator_hash_)._M_h._M_single_bucket;
  (this->generator_hash_)._M_h._M_bucket_count = 1;
  (this->generator_hash_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->generator_hash_)._M_h._M_element_count = 0;
  (this->generator_hash_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->enum_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->enum_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->max_instance_id_ = 0;
  this->max_stmt_id_ = 0;
  p_Var1 = &(this->enum_defs_)._M_t._M_impl.super__Rb_tree_header;
  (this->generator_hash_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->generator_hash_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->enum_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->enum_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->enum_defs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->empty_generators_)._M_h._M_buckets = &(this->empty_generators_)._M_h._M_single_bucket;
  (this->empty_generators_)._M_h._M_bucket_count = 1;
  (this->empty_generators_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->empty_generators_)._M_h._M_element_count = 0;
  (this->empty_generators_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->empty_generators_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->empty_generators_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->track_generated_ = false;
  (this->tracked_generators_)._M_h._M_buckets = &(this->tracked_generators_)._M_h._M_single_bucket;
  (this->tracked_generators_)._M_h._M_bucket_count = 1;
  (this->tracked_generators_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tracked_generators_)._M_h._M_element_count = 0;
  (this->tracked_generators_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tracked_generators_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tracked_generators_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Context() = default;